

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O3

int Ifd_ManFindDsd(Ifd_Man_t *pMan,char *p)

{
  int iVar1;
  char *local_20;
  
  if (*p == '1') {
    if (p[1] == '\0') {
      iVar1 = 1;
      goto LAB_0040d528;
    }
  }
  else if ((*p == '0') && (p[1] == '\0')) {
    iVar1 = 0;
    goto LAB_0040d528;
  }
  local_20 = p;
  Ifd_ManComputeMatches(p);
  iVar1 = Ifd_ManFindDsd_rec(pMan,p,&local_20,Ifd_ManComputeMatches::pMatches);
  p = local_20;
LAB_0040d528:
  local_20 = p + 1;
  if (p[1] == '\0') {
    return iVar1;
  }
  __assert_fail("*++p == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmPre.c"
                ,0x250,"int Ifd_ManFindDsd(Ifd_Man_t *, char *)");
}

Assistant:

int Ifd_ManFindDsd( Ifd_Man_t * pMan, char * p )
{
    int Res;
    if ( *p == '0' && *(p+1) == 0 )
        Res = 0;
    else if ( *p == '1' && *(p+1) == 0 )
        Res = 1;
    else
        Res = Ifd_ManFindDsd_rec( pMan, p, &p, Ifd_ManComputeMatches(p) );
    assert( *++p == 0 );
    return Res;
}